

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O1

string * __thiscall
duckdb::DuckCatalog::GetDBPath_abi_cxx11_(string *__return_storage_ptr__,DuckCatalog *this)

{
  pointer pcVar1;
  StorageManager *pSVar2;
  
  pSVar2 = AttachedDatabase::GetStorageManager((this->super_Catalog).db);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pSVar2->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pSVar2->path)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string DuckCatalog::GetDBPath() {
	return db.GetStorageManager().GetDBPath();
}